

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_cHRM(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  long in_RSI;
  ucvector *in_RDI;
  uint error;
  uchar *chunk;
  uchar *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = lodepng_chunk_init((uchar **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                             ,in_RDI,(uint)((ulong)in_RSI >> 0x20),(char *)in_stack_ffffffffffffffe0
                            );
  if (uVar1 == 0) {
    lodepng_set32bitInt(in_stack_ffffffffffffffe0 + 8,*(uint *)(in_RSI + 0xc0));
    lodepng_set32bitInt(in_stack_ffffffffffffffe0 + 0xc,*(uint *)(in_RSI + 0xc4));
    lodepng_set32bitInt(in_stack_ffffffffffffffe0 + 0x10,*(uint *)(in_RSI + 200));
    lodepng_set32bitInt(in_stack_ffffffffffffffe0 + 0x14,*(uint *)(in_RSI + 0xcc));
    lodepng_set32bitInt(in_stack_ffffffffffffffe0 + 0x18,*(uint *)(in_RSI + 0xd0));
    lodepng_set32bitInt(in_stack_ffffffffffffffe0 + 0x1c,*(uint *)(in_RSI + 0xd4));
    lodepng_set32bitInt(in_stack_ffffffffffffffe0 + 0x20,*(uint *)(in_RSI + 0xd8));
    lodepng_set32bitInt(in_stack_ffffffffffffffe0 + 0x24,*(uint *)(in_RSI + 0xdc));
    lodepng_chunk_generate_crc(in_stack_ffffffffffffffe0);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_cHRM(ucvector* out, const LodePNGInfo* info) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 32, "cHRM"));
  lodepng_set32bitInt(chunk + 8, info->chrm_white_x);
  lodepng_set32bitInt(chunk + 12, info->chrm_white_y);
  lodepng_set32bitInt(chunk + 16, info->chrm_red_x);
  lodepng_set32bitInt(chunk + 20, info->chrm_red_y);
  lodepng_set32bitInt(chunk + 24, info->chrm_green_x);
  lodepng_set32bitInt(chunk + 28, info->chrm_green_y);
  lodepng_set32bitInt(chunk + 32, info->chrm_blue_x);
  lodepng_set32bitInt(chunk + 36, info->chrm_blue_y);
  lodepng_chunk_generate_crc(chunk);
  return 0;
}